

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

int distmin(int x0,int y0,int x1,int y1)

{
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  int dy;
  int dx;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  
  local_1c = x0 - x1;
  local_20 = y0 - y1;
  if (local_1c < 0) {
    local_1c = -local_1c;
  }
  if (local_20 < 0) {
    local_20 = -local_20;
  }
  if (local_1c < local_20) {
    local_24 = local_20;
  }
  else {
    local_24 = local_1c;
  }
  return local_24;
}

Assistant:

int distmin(int x0, int y0, int x1, int y1)
{
    int dx = x0 - x1, dy = y0 - y1;
    if (dx < 0) dx = -dx;
    if (dy < 0) dy = -dy;
  /*  The minimum number of moves to get from (x0,y0) to (x1,y1) is the
   :  larger of the [absolute value of the] two deltas.
   */
    return (dx < dy) ? dy : dx;
}